

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_enc.c
# Opt level: O0

void VP8EncInitAlpha(VP8Encoder *enc)

{
  int iVar1;
  WebPWorkerInterface *pWVar2;
  long in_RDI;
  WebPWorker *worker;
  WebPPicture *in_stack_ffffffffffffffe8;
  
  WebPInitAlphaProcessing();
  iVar1 = WebPPictureHasTransparency(in_stack_ffffffffffffffe8);
  *(int *)(in_RDI + 0x21c) = iVar1;
  *(undefined8 *)(in_RDI + 0x220) = 0;
  *(undefined4 *)(in_RDI + 0x228) = 0;
  if (0 < *(int *)(in_RDI + 0x5c50)) {
    pWVar2 = WebPGetWorkerInterface();
    (*pWVar2->Init)((WebPWorker *)(in_RDI + 0x230));
    *(long *)(in_RDI + 0x248) = in_RDI;
    *(undefined8 *)(in_RDI + 0x250) = 0;
    *(code **)(in_RDI + 0x240) = CompressAlphaJob;
  }
  return;
}

Assistant:

void VP8EncInitAlpha(VP8Encoder* const enc) {
  WebPInitAlphaProcessing();
  enc->has_alpha_ = WebPPictureHasTransparency(enc->pic_);
  enc->alpha_data_ = NULL;
  enc->alpha_data_size_ = 0;
  if (enc->thread_level_ > 0) {
    WebPWorker* const worker = &enc->alpha_worker_;
    WebPGetWorkerInterface()->Init(worker);
    worker->data1 = enc;
    worker->data2 = NULL;
    worker->hook = CompressAlphaJob;
  }
}